

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

qint64 __thiscall QFSFileEnginePrivate::readFdFh(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  QAbstractFileEngine *this_00;
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  __off64_t __off;
  int *piVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if (len < 0) {
    iVar1 = 0x16;
  }
  else {
    if (this->fh == (FILE *)0x0) {
      if (this->fd == -1) {
        qVar5 = 0;
        goto LAB_0011b48e;
      }
      qVar5 = 0;
      do {
        sVar2 = len - qVar5;
        if (0x7ffffffffffffffe < sVar2) {
          sVar2 = 0x7fffffffffffffff;
        }
        iVar1 = this->fd;
        do {
          sVar3 = read(iVar1,data + qVar5,sVar2);
          if (sVar3 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      } while ((0 < sVar3) && (qVar5 = qVar5 + sVar3, qVar5 < len));
      bVar6 = sVar3 == 0;
    }
    else {
      qVar5 = 0;
      do {
        sVar2 = fread(data + qVar5,1,len - qVar5,(FILE *)this->fh);
        iVar1 = feof((FILE *)this->fh);
        bVar6 = iVar1 != 0;
        if (sVar2 == 0 && bVar6) {
          __stream = (FILE *)this->fh;
          __off = ftello64(__stream);
          fseeko64(__stream,__off,0);
          bVar6 = true;
          goto LAB_0011b490;
        }
        qVar5 = qVar5 + sVar2;
        if (iVar1 != 0) goto LAB_0011b490;
        if (sVar2 == 0) {
          piVar4 = __errno_location();
          bVar6 = *piVar4 == 4;
        }
        else {
          bVar6 = qVar5 < len;
        }
      } while (bVar6);
LAB_0011b48e:
      bVar6 = false;
    }
LAB_0011b490:
    if ((bVar6) || (qVar5 != 0)) goto LAB_0011b4e5;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
  }
  QSystemError::stdString(&local_50,iVar1);
  QAbstractFileEngine::setError(this_00,ReadError,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  qVar5 = -1;
LAB_0011b4e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar5;
}

Assistant:

qint64 QFSFileEnginePrivate::readFdFh(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (len < 0 || len != qint64(size_t(len))) {
        q->setError(QFile::ReadError, QSystemError::stdString(EINVAL));
        return -1;
    }

    qint64 readBytes = 0;
    bool eof = false;

    if (fh) {
        // Buffered stdlib mode.

        size_t result;
        do {
            result = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            eof = feof(fh); // Doesn't change errno
            if (eof && result == 0) {
                // On OS X, this is needed, e.g., if a file was written to
                // through another stream since our last read. See test
                // tst_QFile::appendAndRead
                QT_FSEEK(fh, QT_FTELL(fh), SEEK_SET); // re-sync stream.
                break;
            }
            readBytes += result;
        } while (!eof && (result == 0 ? errno == EINTR : readBytes < len));

    } else if (fd != -1) {
        // Unbuffered stdio mode.

        SignedIOType result;
        do {
            // calculate the chunk size
            // on Windows or 32-bit no-largefile Unix, we'll need to read in chunks
            // we limit to the size of the signed type, otherwise we could get a negative number as a result
            quint64 wantedBytes = quint64(len) - quint64(readBytes);
            UnsignedIOType chunkSize = std::numeric_limits<SignedIOType>::max();
            if (chunkSize > wantedBytes)
                chunkSize = wantedBytes;
            result = QT_READ(fd, data + readBytes, chunkSize);
        } while (result > 0 && (readBytes += result) < len);

        // QT_READ (::read()) returns 0 to indicate end-of-file
        eof = result == 0;
    }

    if (!eof && readBytes == 0) {
        readBytes = -1;
        q->setError(QFile::ReadError, QSystemError::stdString(errno));
    }

    return readBytes;
}